

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_sse_single(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined2 uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int i_1;
  int i;
  uint uVar7;
  int j;
  uint16_t *puVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 local_48 [64];
  
  auVar6 = vpmovzxbw_avx(ZEXT816(0x8040201008040201));
  auVar22 = ZEXT1664((undefined1  [16])0x0);
  uVar7 = 0;
  puVar8 = data;
  while (uVar7 != len >> 0xf) {
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    lVar10 = 0;
    while( true ) {
      auVar21 = auVar25._0_16_;
      if ((int)lVar10 == 0x10000) break;
      uVar1 = *(undefined2 *)((long)puVar8 + lVar10);
      auVar26._2_2_ = uVar1;
      auVar26._0_2_ = uVar1;
      auVar26._4_2_ = uVar1;
      auVar26._6_2_ = uVar1;
      auVar26._8_2_ = uVar1;
      auVar26._10_2_ = uVar1;
      auVar26._12_2_ = uVar1;
      auVar26._14_2_ = uVar1;
      auVar11 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)puVar8 + lVar10 + 4)));
      auVar12 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)puVar8 + lVar10 + 8)));
      auVar13 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)puVar8 + lVar10 + 0xc)));
      auVar14 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)puVar8 + lVar10 + 0x10)));
      auVar15 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)puVar8 + lVar10 + 0x14)));
      uVar1 = *(undefined2 *)((long)puVar8 + lVar10 + 0xc);
      auVar28._2_2_ = uVar1;
      auVar28._0_2_ = uVar1;
      auVar28._4_2_ = uVar1;
      auVar28._6_2_ = uVar1;
      auVar28._8_2_ = uVar1;
      auVar28._10_2_ = uVar1;
      auVar28._12_2_ = uVar1;
      auVar28._14_2_ = uVar1;
      uVar1 = *(undefined2 *)((long)puVar8 + lVar10 + 0xe);
      auVar27._2_2_ = uVar1;
      auVar27._0_2_ = uVar1;
      auVar27._4_2_ = uVar1;
      auVar27._6_2_ = uVar1;
      auVar27._8_2_ = uVar1;
      auVar27._10_2_ = uVar1;
      auVar27._12_2_ = uVar1;
      auVar27._14_2_ = uVar1;
      lVar10 = lVar10 + 0x10;
      auVar3 = vpand_avx(auVar26,_DAT_0010f080);
      auVar26 = vpand_avx(auVar26,auVar6);
      auVar16 = vpandq_avx512vl(auVar11,_DAT_0010f080);
      auVar17 = vpandq_avx512vl(auVar12,_DAT_0010f080);
      auVar18 = vpandq_avx512vl(auVar13,_DAT_0010f080);
      auVar19 = vpandq_avx512vl(auVar14,_DAT_0010f080);
      auVar20 = vpandq_avx512vl(auVar15,_DAT_0010f080);
      auVar4 = vpand_avx(auVar28,_DAT_0010f080);
      auVar5 = vpand_avx(auVar27,_DAT_0010f080);
      auVar26 = vpcmpeqw_avx(auVar26,auVar6);
      auVar3 = vpcmpeqw_avx(auVar3,_DAT_0010f080);
      auVar16 = vpcmpeqw_avx(auVar16,_DAT_0010f080);
      auVar17 = vpcmpeqw_avx(auVar17,_DAT_0010f080);
      auVar18 = vpcmpeqw_avx(auVar18,_DAT_0010f080);
      auVar19 = vpcmpeqw_avx(auVar19,_DAT_0010f080);
      auVar20 = vpcmpeqw_avx(auVar20,_DAT_0010f080);
      auVar4 = vpcmpeqw_avx(auVar4,_DAT_0010f080);
      auVar5 = vpcmpeqw_avx(auVar5,_DAT_0010f080);
      auVar26 = vpsubw_avx(auVar24._0_16_,auVar26);
      auVar11 = vpandq_avx512vl(auVar11,auVar6);
      auVar3 = vpsubw_avx(auVar21,auVar3);
      auVar21 = vpcmpeqw_avx(auVar11,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar16);
      auVar26 = vpsubw_avx(auVar26,auVar21);
      auVar21 = vpandq_avx512vl(auVar12,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar17);
      auVar21 = vpcmpeqw_avx(auVar21,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar18);
      auVar26 = vpsubw_avx(auVar26,auVar21);
      auVar21 = vpandq_avx512vl(auVar13,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar19);
      auVar21 = vpcmpeqw_avx(auVar21,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar20);
      auVar26 = vpsubw_avx(auVar26,auVar21);
      auVar21 = vpandq_avx512vl(auVar14,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar4);
      auVar21 = vpcmpeqw_avx(auVar21,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar5);
      auVar25 = ZEXT1664(auVar3);
      auVar3 = vpsubw_avx(auVar26,auVar21);
      auVar21 = vpandq_avx512vl(auVar15,auVar6);
      auVar21 = vpcmpeqw_avx(auVar21,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar21);
      auVar21 = vpand_avx(auVar28,auVar6);
      auVar21 = vpcmpeqw_avx(auVar21,auVar6);
      auVar3 = vpsubw_avx(auVar3,auVar21);
      auVar21 = vpand_avx(auVar27,auVar6);
      auVar21 = vpcmpeqw_avx(auVar21,auVar6);
      auVar21 = vpsubw_avx(auVar3,auVar21);
      auVar24 = ZEXT1664(auVar21);
    }
    auVar23._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar24._0_16_;
    auVar23._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar21;
    uVar7 = uVar7 + 1;
    puVar8 = puVar8 + 0x8000;
    auVar24 = vpmovzxwd_avx512f(auVar23);
    auVar22 = vpaddd_avx512f(auVar22,auVar24);
  }
  local_48 = vmovdqu64_avx512f(auVar22);
  for (lVar10 = (long)(int)(len & 0xffff8000); (uint)lVar10 < len; lVar10 = lVar10 + 1) {
    uVar2 = data[lVar10];
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      *(uint *)(local_48 + lVar9 * 4) =
           *(int *)(local_48 + lVar9 * 4) + (uint)((uVar2 >> ((uint)lVar9 & 0x1f) & 1) != 0);
    }
  }
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
    flags[lVar10] = *(uint32_t *)(local_48 + lVar10 * 4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_single(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m128i counterLo = _mm_set1_epi16(0);
    __m128i counterHi = _mm_set1_epi16(0);
    const __m128i one_mask =  _mm_set1_epi16(1);
    // set_epi is parameterized backwards (15->0)
    const __m128i masksLo = _mm_set_epi16(-32768, 1 << 14, 1 << 13, 1 << 12,
                                          1 << 11, 1 << 10, 1 << 9,  1 << 8);
    const __m128i masksHi = _mm_set_epi16(1 << 7,  1 << 6,  1 << 5,  1 << 4,
                                          1 << 3,  1 << 2,  1 << 1,  1 << 0);

    uint32_t out_counters[16] = {0};
    const __m128i* data_vectors = (const __m128i*)(data);
    const uint32_t n_cycles = len / 8;
    const uint32_t n_update_cycles = n_cycles / 4096;

#define UPDATE_LO(idx) counterLo = _mm_add_epi16(counterLo, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksLo), masksLo), one_mask));
#define UPDATE_HI(idx) counterHi = _mm_add_epi16(counterHi, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksHi), masksHi), one_mask));
#define BLOCK {                                         \
    UPDATE_LO(0) UPDATE_LO(1) UPDATE_LO(2) UPDATE_LO(3) \
    UPDATE_LO(4) UPDATE_LO(5) UPDATE_LO(6) UPDATE_LO(7) \
    UPDATE_HI(0) UPDATE_HI(1) UPDATE_HI(2) UPDATE_HI(3) \
    UPDATE_HI(4) UPDATE_HI(5) UPDATE_HI(6) UPDATE_HI(7) \
}
#define UH(idx) out_counters[idx] += _mm_extract_epi16(counterLo, idx - 8);
#define UL(idx) out_counters[idx] += _mm_extract_epi16(counterHi, idx);

    uint32_t pos = 0;
    for (int i = 0; i < n_update_cycles; ++i) { // each block of 65536 values
        for (int k = 0; k < 4096; ++k, ++pos) { // max sum of each 16-bit value in a register (65536/16)
            BLOCK
        }

        // Compute vector sum (unroll to prevent possible compiler errors
        // regarding constness of parameter N in _mm_extract_epi16).
        UL(0)  UL(1)  UL(2)  UL(3)
        UL(4)  UL(5)  UL(6)  UL(7)
        UH(8)  UH(9)  UH(10) UH(11)
        UH(12) UH(13) UH(14) UH(15)
        counterLo = _mm_set1_epi16(0);
        counterHi = _mm_set1_epi16(0);
    }

#undef UL
#undef UH
#undef BLOCK
#undef UPDATE_HI
#undef UPDATE_LO

    // residual
    for (int i = pos*8; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}